

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_timer.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  char cVar6;
  undefined8 uVar7;
  long lVar8;
  ALLEGRO_EVENT_QUEUE *pAVar9;
  int iVar10;
  char *format;
  int iVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  undefined4 uVar15;
  float fVar16;
  undefined4 uVar17;
  float fVar18;
  ALLEGRO_EVENT event;
  ALLEGRO_TRANSFORM trans;
  double dStack_e0;
  int local_b8 [6];
  int local_a0;
  undefined4 uStack_9c;
  int local_98;
  int local_94;
  undefined1 local_70 [64];
  
  cVar6 = al_install_system(0x5020700,atexit);
  if (cVar6 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      format = "Could not create display\n";
    }
    else {
      font = (ALLEGRO_FONT *)al_create_builtin_font();
      if (font == (ALLEGRO_FONT *)0x0) {
        format = "Could not create font\n";
      }
      else {
        cVar6 = al_install_audio();
        if (cVar6 == '\0') {
          format = "Could not init sound\n";
        }
        else {
          cVar6 = al_reserve_samples(0x10);
          if (cVar6 == '\0') {
            format = "Could not set up voice and mixer\n";
          }
          else {
            uVar7 = al_malloc_with_context
                              (0x15888000,0x1b,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/examples/ex_audio_timer.c"
                               ,"create_sample_s16");
            iVar10 = 0x2000;
            ping = (ALLEGRO_SAMPLE *)al_create_sample(uVar7,0x2000,0x5622,1,0x10,1);
            if (ping == (ALLEGRO_SAMPLE *)0x0) {
              ping = (ALLEGRO_SAMPLE *)0x0;
            }
            else {
              lVar8 = al_get_sample_data(ping);
              fVar14 = 0.0;
              fVar16 = 0.0;
              lVar12 = 0;
              do {
                fVar18 = (float)(int)lVar12 * 0.00012207031 * 8.0;
                if (1.0 <= fVar18) {
                  fVar18 = 1.0;
                }
                dVar2 = (double)fVar14;
                auVar1._8_4_ = SUB84((double)fVar16,0);
                auVar1._0_8_ = dVar2;
                auVar1._12_4_ = (int)((ulong)(double)fVar16 >> 0x20);
                dVar3 = sin(dVar2);
                dStack_e0 = auVar1._8_8_;
                dVar4 = sin(dStack_e0);
                *(short *)(lVar8 + lVar12 * 2) =
                     (short)(int)((double)(fVar18 * (float)iVar10 * 0.00012207031 * 4000.0) *
                                 (dVar4 + dVar3 + -1.0));
                fVar14 = (float)(dVar2 + 0.1);
                fVar16 = (float)(dStack_e0 + 0.15);
                lVar12 = lVar12 + 1;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
              if (ping != (ALLEGRO_SAMPLE *)0x0) {
                timer = (ALLEGRO_TIMER *)al_create_timer(0);
                al_set_timer_count(timer,0xffffffffffffffff);
                pAVar9 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
                event_queue = pAVar9;
                uVar7 = al_get_keyboard_event_source();
                al_register_event_source(pAVar9,uVar7);
                pAVar9 = event_queue;
                uVar7 = al_get_timer_event_source(timer);
                al_register_event_source(pAVar9,uVar7);
                al_identity_transform(local_70);
                al_scale_transform(0x41800000,0x41800000,local_70);
                al_use_transform(local_70);
                al_start_timer(timer);
                iVar11 = 4;
                iVar10 = 0;
                bVar5 = false;
                while (bVar13 = bVar5, al_wait_for_event(event_queue,local_b8), local_b8[0] == 0xb)
                {
                  if (local_98 == 0x3b) {
                    return 0;
                  }
                  if ((local_94 == 0x3d) || (local_94 == 0x2b)) {
                    if (iVar11 < 0x20) {
                      iVar11 = iVar11 + 1;
                      goto LAB_0010278e;
                    }
                  }
                  else if (1 < iVar11 && local_94 == 0x2d) {
                    iVar11 = iVar11 + -1;
LAB_0010278e:
                    al_set_timer_speed(SUB84(1.0 / (double)iVar11,0),timer);
                  }
LAB_001027ae:
                  bVar5 = false;
                  if (bVar13) {
LAB_001027be:
                    cVar6 = al_is_event_queue_empty(event_queue);
                    bVar5 = true;
                    if (cVar6 != '\0') {
                      if ((uint)(iVar10 * -0x33333333) < 0x33333334) {
                        uVar15 = 0x3f800000;
                        uVar17 = 0x3f800000;
                      }
                      else {
                        uVar15 = 0x3f000000;
                        uVar17 = 0x3f000000;
                      }
                      uVar15 = al_map_rgb_f(uVar15,uVar17,0x3f800000);
                      al_map_rgb(0,0,0);
                      al_clear_to_color();
                      al_draw_textf(uVar15,uVar17,0x41a00000,0x41300000,font,1,"%u",iVar10);
                      al_flip_display();
                    }
                  }
                }
                if (local_b8[0] != 0x1e) goto LAB_001027ae;
                dVar2 = pow(1.05,(double)(CONCAT44(uStack_9c,local_a0) % 5));
                cVar6 = al_play_sample(0x3f800000,0,(float)dVar2,ping,0x100,0);
                iVar10 = local_a0;
                if (cVar6 == '\0') {
                  log_printf("Not enough reserved samples.\n");
                  iVar10 = local_a0;
                }
                goto LAB_001027be;
              }
            }
            format = "Could not generate sample\n";
          }
        }
      }
    }
  }
  abort_example(format);
  iVar10 = __cxa_atexit();
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TRANSFORM trans;
   ALLEGRO_EVENT event;
   int bps = 4;
   bool redraw = false;
   unsigned int last_timer = 0;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Could not create display\n");
   }

   font = al_create_builtin_font();
   if (!font) {
      abort_example("Could not create font\n");
   }

   if (!al_install_audio()) {
      abort_example("Could not init sound\n");
   }

   if (!al_reserve_samples(RESERVED_SAMPLES)) {
      abort_example("Could not set up voice and mixer\n");
   }

   ping = generate_ping();
   if (!ping) {
      abort_example("Could not generate sample\n");
   }

   timer = al_create_timer(1.0 / bps);
   al_set_timer_count(timer, -1);

   event_queue = al_create_event_queue();
   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_timer_event_source(timer));

   al_identity_transform(&trans);
   al_scale_transform(&trans, 16.0, 16.0);
   al_use_transform(&trans);

   al_start_timer(timer);

   while (true) {
      al_wait_for_event(event_queue, &event);
      if (event.type == ALLEGRO_EVENT_TIMER) {
         const float speed = pow(21.0/20.0, (event.timer.count % PERIOD));
         if (!al_play_sample(ping, 1.0, 0.0, speed, ALLEGRO_PLAYMODE_ONCE, NULL)) {
            log_printf("Not enough reserved samples.\n");
         }
         redraw = true;
         last_timer = event.timer.count;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         if (event.keyboard.unichar == '+' || event.keyboard.unichar == '=') {
            if (bps < 32) {
               bps++;
               al_set_timer_speed(timer, 1.0 / bps);
            }
         }
         else if (event.keyboard.unichar == '-') {
            if (bps > 1) {
               bps--;
               al_set_timer_speed(timer, 1.0 / bps);
            }
         }
      }

      if (redraw && al_is_event_queue_empty(event_queue)) {
         ALLEGRO_COLOR c;
         if (last_timer % PERIOD == 0)
            c = al_map_rgb_f(1, 1, 1);
         else
            c = al_map_rgb_f(0.5, 0.5, 1.0);

         al_clear_to_color(al_map_rgb(0, 0, 0));
         al_draw_textf(font, c, 640/32, 480/32 - 4, ALLEGRO_ALIGN_CENTRE,
            "%u", last_timer);
         al_flip_display();
      }
   }

   close_log(false);

   return 0;
}